

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

void send_handshake_bytes(TLS_IO_INSTANCE *tls_io_instance)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  ulong e;
  char *pcVar3;
  char *pcVar4;
  LOGGER_LOG l;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 uVar5;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  ERR_clear_error();
  iVar1 = SSL_do_handshake((SSL *)tls_io_instance->ssl);
  if (iVar1 == 1) {
    tls_io_instance->tlsio_state = TLSIO_STATE_OPEN;
    indicate_open_complete(tls_io_instance,IO_OPEN_OK);
    return;
  }
  iVar1 = SSL_get_error((SSL *)tls_io_instance->ssl,iVar1);
  if (iVar1 - 4U < 0xfffffffe) {
    p_Var2 = xlogging_get_log_function();
    if (iVar1 == 1) {
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010bf21;
      e = ERR_get_error();
      pcVar3 = ERR_error_string(e,(char *)0x0);
      pcVar4 = "%s";
      iVar1 = 0x2e0;
    }
    else {
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_0010bf21;
      pcVar3 = (char *)CONCAT44(uVar5,iVar1);
      pcVar4 = "SSL handshake failed: %d";
      iVar1 = 0x2e4;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
              ,"send_handshake_bytes",iVar1,1,pcVar4,pcVar3);
  }
  else {
    iVar1 = write_outgoing_bytes(tls_io_instance,(ON_SEND_COMPLETE)0x0,(void *)0x0);
    if (iVar1 == 0) {
      return;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                ,"send_handshake_bytes",0x2ec,1,"Error in write_outgoing_bytes.");
    }
  }
LAB_0010bf21:
  tls_io_instance->tlsio_state = TLSIO_STATE_HANDSHAKE_FAILED;
  return;
}

Assistant:

static void send_handshake_bytes(TLS_IO_INSTANCE* tls_io_instance)
{
    int hsret;
    // ERR_clear_error must be called before any call that might set an
    // SSL_get_error result
    ERR_clear_error();
    hsret = SSL_do_handshake(tls_io_instance->ssl);
    if (hsret != SSL_DO_HANDSHAKE_SUCCESS)
    {
        int ssl_err = SSL_get_error(tls_io_instance->ssl, hsret);
        if (ssl_err != SSL_ERROR_WANT_READ && ssl_err != SSL_ERROR_WANT_WRITE)
        {
            if (ssl_err == SSL_ERROR_SSL)
            {
                LogError("%s", ERR_error_string(ERR_get_error(), NULL));
            }
            else
            {
                LogError("SSL handshake failed: %d", ssl_err);
            }
            tls_io_instance->tlsio_state = TLSIO_STATE_HANDSHAKE_FAILED;
        }
        else
        {
            if (write_outgoing_bytes(tls_io_instance, NULL, NULL) != 0)
            {
                LogError("Error in write_outgoing_bytes.");
                tls_io_instance->tlsio_state = TLSIO_STATE_HANDSHAKE_FAILED;
            }
        }
    }
    else
    {
        tls_io_instance->tlsio_state = TLSIO_STATE_OPEN;
        indicate_open_complete(tls_io_instance, IO_OPEN_OK);
    }
}